

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textureinfo.h
# Opt level: O1

bool __thiscall DDSHeader::LoadHeader(DDSHeader *this,ifstream *file,string *error_string)

{
  undefined8 in_RAX;
  bool bVar1;
  uint32_t identifier;
  int local_24;
  
  local_24 = (int)((ulong)in_RAX >> 0x20);
  if (((byte)file[*(long *)(*(long *)file + -0x18) + 0x20] & 5) == 0) {
    std::istream::seekg(file,0,0);
    std::istream::read((char *)file,(long)&local_24);
    bVar1 = local_24 == 0x20534444;
    if (bVar1) {
      if ((((this->impl_).pixel_format.flags & 4) != 0) &&
         ((this->impl_).pixel_format.fourcc == 0x30315844)) {
        std::istream::read((char *)file,(long)&this->dx10_impl_);
      }
      std::istream::read((char *)file,(long)&this->impl_);
      std::ifstream::close();
    }
    else {
      std::__cxx11::string::_M_replace
                ((ulong)error_string,0,(char *)error_string->_M_string_length,0x13b8dd);
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

virtual bool LoadHeader(std::ifstream& file, std::string& error_string) {
    HEADER_PRE_LOAD(file)
    std::uint32_t identifier;
    file.read(reinterpret_cast<char*>(&identifier), sizeof(identifier));
    if(identifier != DDSInfo::kIdentifier) {
      error_string = "Header does not contain a valid DDS identifier";
      return false;
    }
    bool has_dx10_header = (impl_.pixel_format.flags & DDSInfo::e_fourCC) &&
	                     impl_.pixel_format.fourcc == MakeFourCC('D', 'X', '1', '0');
    if(has_dx10_header)
      file.read(reinterpret_cast<char*>(&this->dx10_impl_), sizeof(this->dx10_impl_));
    file.read(reinterpret_cast<char*>(&this->impl_), sizeof(this->impl_));
    HEADER_POST_LOAD(file)
  }